

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumDescriptorProto::SharedDtor(EnumDescriptorProto *this)

{
  EnumDescriptorProto *pEVar1;
  EnumDescriptorProto *in_RDI;
  string *default_value;
  ArenaStringPtr *in_stack_ffffffffffffff90;
  
  default_value = (string *)&in_RDI->name_;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(in_stack_ffffffffffffff90,default_value);
  pEVar1 = internal_default_instance();
  if ((in_RDI != pEVar1) && (in_RDI->options_ != (EnumOptions *)0x0)) {
    (*(in_RDI->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void EnumDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaNoVirtual() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}